

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O3

ssize_t __thiscall PackageList::write(PackageList *this,int __fd,void *__buf,size_t __n)

{
  _func_int **pp_Var1;
  _Base_ptr p_Var2;
  Value *pVVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  ssize_t extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  _Base_ptr p_Var6;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Value root;
  StyledWriter writer;
  ofstream fout;
  undefined1 local_2f8 [88];
  StyledWriter local_2a0;
  ValueHolder local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2f8._32_8_ = CONCAT44(in_register_00000034,__fd);
  Json::Value::Value((Value *)(local_2f8 + 0x30),nullValue);
  p_Var4 = (this->packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2f8._40_8_ = &(this->packages)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var4 != (_Base_ptr)local_2f8._40_8_) {
    do {
      Json::Value::Value((Value *)&local_230,nullValue);
      Json::Value::Value((Value *)&local_2a0,(String *)(p_Var4 + 3));
      pVVar3 = Json::Value::operator[]((Value *)&local_230,"version");
      Json::Value::operator=(pVVar3,(Value *)&local_2a0);
      Json::Value::~Value((Value *)&local_2a0);
      p_Var2 = p_Var4[4]._M_parent;
      for (p_Var6 = *(_Base_ptr *)(p_Var4 + 4); p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
        pVVar3 = Json::Value::operator[]((Value *)&local_230,"include");
        Json::Value::Value((Value *)&local_2a0,(String *)p_Var6);
        Json::Value::append(pVVar3,(Value *)&local_2a0);
        Json::Value::~Value((Value *)&local_2a0);
      }
      p_Var2 = *(_Base_ptr *)(p_Var4 + 5);
      for (p_Var6 = p_Var4[4]._M_right; p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
        pVVar3 = Json::Value::operator[]((Value *)&local_230,"lib");
        Json::Value::Value((Value *)&local_2a0,(String *)p_Var6);
        Json::Value::append(pVVar3,(Value *)&local_2a0);
        Json::Value::~Value((Value *)&local_2a0);
      }
      p_Var2 = p_Var4[5]._M_right;
      for (p_Var6 = p_Var4[5]._M_left; p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
        pVVar3 = Json::Value::operator[]((Value *)&local_230,"dll");
        Json::Value::Value((Value *)&local_2a0,(String *)p_Var6);
        Json::Value::append(pVVar3,(Value *)&local_2a0);
        Json::Value::~Value((Value *)&local_2a0);
      }
      pVVar3 = Json::Value::operator[]((Value *)(local_2f8 + 0x30),(String *)(p_Var4 + 2));
      Json::Value::operator=(pVVar3,(Value *)&local_230);
      Json::Value::~Value((Value *)&local_230);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Base_ptr)local_2f8._40_8_);
  }
  Json::StyledWriter::StyledWriter(&local_2a0);
  pp_Var1 = (_func_int **)(local_2f8 + 0x10);
  local_2f8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f8,*(long *)(local_2f8._32_8_ + 0xa0),
             *(long *)(local_2f8._32_8_ + 0xa8) + *(long *)(local_2f8._32_8_ + 0xa0));
  std::__cxx11::string::append(local_2f8);
  std::ofstream::ofstream(&local_230,(string *)local_2f8,_S_out);
  if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2f8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
  }
  Json::StyledWriter::write_abi_cxx11_
            ((StyledWriter *)local_2f8,(int)&local_2a0,local_2f8 + 0x30,__n);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230.bool_,(char *)local_2f8._0_8_,local_2f8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2f8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
  }
  std::ofstream::close();
  local_230.int_ = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  Json::StyledWriter::~StyledWriter(&local_2a0);
  Json::Value::~Value((Value *)(local_2f8 + 0x30));
  return extraout_RAX;
}

Assistant:

void write(CCDir dir){
        Json::Value root;
        for(auto&p:packages){
            Json::Value item;
            item["version"]=p.second.version;
            for(auto&e:p.second.include_files){
                item["include"].append(e);
            }
            for(auto&e:p.second.lib_files){
                item["lib"].append(e);
            }
            for(auto&e:p.second.dll_files){
                item["dll"].append(e);
            }
            root[p.second.name]=item;
        }
        Json::StyledWriter writer;
        std::ofstream fout(dir.compiler_path+"cip_list.json",std::ios::out);
        fout << writer.write(root) << std::endl;
        fout.close();
	}